

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  int iVar1;
  Index IVar2;
  undefined4 extraout_var;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_288;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_278;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_248;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_210;
  undefined1 local_1f0 [8];
  Matrix3 v;
  Vector3 v2;
  Vector3 v1;
  Vector x0;
  Scalar local_158;
  Type local_150;
  Scalar local_118;
  Type local_110;
  ConstantReturnType local_d8;
  undefined1 local_c0 [8];
  Vector dx;
  IdentityReturnType local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_90;
  ConstantReturnType local_40;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  double local_18;
  double dt_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  local_18 = dt;
  dt_local = (double)this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant(&local_40,0x23,1,&dxFactor);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_28,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_40);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x30,(Vector *)&local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_0046e1f0;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem(&this->functor_,local_18)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->R_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Q_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_a8,6,6);
  dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0x3f1a36e2eb1c432d;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*(&local_90,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
               *)&local_a8,
              (double *)
              &dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->forceVariance_,&local_90);
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withAbsolutePos_ = false;
  this->withComBias_ = false;
  this->withUnmodeledForces_ = false;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->limitTorques_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->limitForces_);
  this->limitOn_ = true;
  optimization::optimization(&this->op_);
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(&this->functor_);
  KalmanFilterBase::setMeasureSize
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,IVar2);
  KalmanFilterBase::setStateSize
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,this->stateSize_
            );
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
  ZeroDelayObserver::setInputSize
            ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,IVar2);
  IVar2 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
  this->inputSize_ = IVar2;
  resetCovarianceMatrices(this);
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (&local_d8,CONCAT44(extraout_var,iVar1),1,&dxFactor);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_c0,&local_d8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_110,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c0,3,3);
  local_118 = 0.0001;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::fill
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_110,&local_118);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_150,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c0,9,3);
  local_158 = 0.0001;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::fill
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_150,&local_158);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_c0);
  EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
            (&this->super_EKFFlexibilityEstimatorBase,
             (Vector *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  ObserverBase::stateVectorZero
            ((ObserverBase *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (&(this->super_EKFFlexibilityEstimatorBase).lastX_,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  ZeroDelayObserver::setState
            ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
             (StateVector *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),0);
  KalmanFilterBase::setStateCovariance
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,&this->Q_);
  ExtendedKalmanFilter::setFunctor
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_,
             &(this->functor_).super_DynamicalSystemFunctorBase);
  IMUElasticLocalFrameDynamicalSystem::setFDstep
            (&this->functor_,&(this->super_EKFFlexibilityEstimatorBase).dx_);
  this->on_ = true;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_1f0);
  local_218 = 100.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_210,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),&local_218);
  local_220 = 100.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_210,&local_220);
  local_228 = 1000.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_228);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_210);
  local_250 = 10.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_248,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8),&local_250);
  local_258 = 10.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_248,&local_258);
  local_260 = 100.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_260);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_248);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f0);
  local_268 = 556.64;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1f0,&local_268);
  local_278 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1f0,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)&this->limitForces_,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_278);
  local_288 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_1f0,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)&this->limitTorques_,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_288);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c0);
  return;
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt)
: EKFFlexibilityEstimatorBase(stateSize,
                              measurementSizeBase_,
                              inputSizeBase_,
                              Matrix::Constant(stateSize, 1, dxFactor)),
  functor_(dt), stateSize_(stateSize), unmodeledForceVariance_(1e-6), forceVariance_(Matrix::Identity(6, 6) * 1e-4),
  absPosVariance_(1e-4), useFTSensors_(false), withAbsolutePos_(false), withComBias_(false),
  withUnmodeledForces_(false), limitOn_(true)
{
  ekf_.setMeasureSize(functor_.getMeasurementSize());
  ekf_.setStateSize(stateSize_);
  ekf_.setInputSize(functor_.getInputSize());
  inputSize_ = functor_.getInputSize();

  ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

  Vector dx(Matrix::Constant(getStateSize(), 1, dxFactor));

  dx.segment(state::ori, 3).fill(1e-4);
  dx.segment(state::angVel, 3).fill(1e-4);

  ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

  Vector x0(ekf_.stateVectorZero());

  lastX_ = x0;
  ekf_.setState(x0, 0);

  ekf_.setStateCovariance(Q_);

  ekf_.setFunctor(&functor_);

  functor_.setFDstep(dx_);

  on_ = true;

  Vector3 v1, v2;
  Matrix3 v;
  v1 << 100, 100, 1000;
  v2 << 10, 10, 100;
  v.setIdentity();
  v *= cst::gravityConstant * hrp2::m;
  limitForces_ = v * v1;
  limitTorques_ = v * v2;
}